

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

SigmoidParameter * __thiscall caffe::LayerParameter::mutable_sigmoid_param(LayerParameter *this)

{
  SigmoidParameter *this_00;
  LayerParameter *this_local;
  
  set_has_sigmoid_param(this);
  if (this->sigmoid_param_ == (SigmoidParameter *)0x0) {
    this_00 = (SigmoidParameter *)operator_new(0x20);
    SigmoidParameter::SigmoidParameter(this_00);
    this->sigmoid_param_ = this_00;
  }
  return this->sigmoid_param_;
}

Assistant:

inline ::caffe::SigmoidParameter* LayerParameter::mutable_sigmoid_param() {
  set_has_sigmoid_param();
  if (sigmoid_param_ == NULL) {
    sigmoid_param_ = new ::caffe::SigmoidParameter;
  }
  // @@protoc_insertion_point(field_mutable:caffe.LayerParameter.sigmoid_param)
  return sigmoid_param_;
}